

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

uchar * xmlSerializeHexCharRef(uchar *out,int val)

{
  bool bVar1;
  uchar *puVar2;
  long lVar3;
  uchar *puVar4;
  
  out[0] = '&';
  out[1] = '#';
  out[2] = 'x';
  lVar3 = 3;
  if ((((0xf < val) && (lVar3 = 4, 0xff < val)) && (lVar3 = 5, 0xfff < val)) &&
     (lVar3 = 6, 0xffff < val)) {
    lVar3 = (ulong)(0xfffff < val) + 7;
  }
  puVar2 = out + lVar3;
  puVar4 = puVar2;
  if (0 < val) {
    do {
      *puVar4 = (&DAT_002044b0)[val & 0xf];
      bVar1 = 0xf < (uint)val;
      puVar4 = puVar4 + -1;
      val = (uint)val >> 4;
    } while (bVar1);
  }
  puVar2[1] = ';';
  puVar2[2] = '\0';
  return puVar2 + 2;
}

Assistant:

static unsigned char *
xmlSerializeHexCharRef(unsigned char *out, int val) {
    unsigned char *ptr;

    *out++ = '&';
    *out++ = '#';
    *out++ = 'x';
    if (val < 0x10) ptr = out;
    else if (val < 0x100) ptr = out + 1;
    else if (val < 0x1000) ptr = out + 2;
    else if (val < 0x10000) ptr = out + 3;
    else if (val < 0x100000) ptr = out + 4;
    else ptr = out + 5;
    out = ptr + 1;
    while (val > 0) {
	switch (val & 0xF) {
	    case 0: *ptr-- = '0'; break;
	    case 1: *ptr-- = '1'; break;
	    case 2: *ptr-- = '2'; break;
	    case 3: *ptr-- = '3'; break;
	    case 4: *ptr-- = '4'; break;
	    case 5: *ptr-- = '5'; break;
	    case 6: *ptr-- = '6'; break;
	    case 7: *ptr-- = '7'; break;
	    case 8: *ptr-- = '8'; break;
	    case 9: *ptr-- = '9'; break;
	    case 0xA: *ptr-- = 'A'; break;
	    case 0xB: *ptr-- = 'B'; break;
	    case 0xC: *ptr-- = 'C'; break;
	    case 0xD: *ptr-- = 'D'; break;
	    case 0xE: *ptr-- = 'E'; break;
	    case 0xF: *ptr-- = 'F'; break;
	    default: *ptr-- = '0'; break;
	}
	val >>= 4;
    }
    *out++ = ';';
    *out = 0;
    return(out);
}